

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O0

void zap_dig(schar dx,schar dy,schar dz)

{
  bool bVar1;
  monst *mon;
  level *plVar2;
  boolean bVar3;
  xchar x;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  obj *obj;
  long lVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  int local_34;
  boolean maze_dig;
  boolean shopwall;
  int iStack_30;
  boolean shopdoor;
  int digdepth;
  int zy;
  int zx;
  obj *otmp;
  monst *mtmp;
  rm *room;
  schar dz_local;
  schar dy_local;
  schar dx_local;
  xchar y;
  
  mon = u.ustuck;
  if ((u._1052_1_ & 1) == 0) {
    if (dz == '\0') {
      bVar1 = false;
      bVar9 = false;
      bVar10 = false;
      if ((*(uint *)&(level->flags).field_0x8 >> 0x11 & 1) != 0) {
        bVar3 = on_level(&u.uz,&dungeon_topology.d_earth_level);
        bVar10 = bVar3 == '\0';
      }
      digdepth = (int)u.ux + (int)dx;
      iStack_30 = (int)u.uy + (int)dy;
      local_34 = rn2(0x12);
      local_34 = local_34 + 8;
      tmp_at(-1,0x40001);
      do {
        plVar2 = level;
        iVar4 = local_34 + -1;
        if ((((iVar4 < 0) || (digdepth < 1)) || (0x4f < digdepth)) ||
           ((iStack_30 < 0 || (0x14 < iStack_30)))) goto LAB_001860d4;
        lVar7 = (long)digdepth;
        lVar8 = (long)iStack_30;
        tmp_at(digdepth,iStack_30);
        (*windowprocs.win_delay)();
        bVar3 = closed_door(level,digdepth,iStack_30);
        x = (xchar)digdepth;
        y = (xchar)iStack_30;
        if ((bVar3 == '\0') && (plVar2->locations[lVar7][lVar8].typ != '\x0f')) {
          if (bVar10) {
            if ((plVar2->locations[lVar7][lVar8].typ == '\0') ||
               ('\f' < plVar2->locations[lVar7][lVar8].typ)) {
              if ((plVar2->locations[lVar7][lVar8].typ == '\r') ||
                 (((*(uint *)&(level->flags).field_0x8 >> 0x14 & 1) != 0 &&
                  (plVar2->locations[lVar7][lVar8].typ == '\0')))) {
                if ((*(uint *)&plVar2->locations[lVar7][lVar8].field_0x6 >> 4 & 8) == 0) {
                  plVar2->locations[lVar7][lVar8].typ = '\x19';
                  unblock_point(digdepth,iStack_30);
                  iVar4 = local_34 + -3;
                }
                else {
                  if (((u.uprops[0x1e].intrinsic == 0) &&
                      (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                       (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
                    pline("The tree shudders but is unharmed.");
                  }
                  local_34 = 0;
                  iVar4 = local_34;
                }
              }
              else if ((plVar2->locations[lVar7][lVar8].typ == '\0') ||
                      (plVar2->locations[lVar7][lVar8].typ == '\x10')) {
                if ((*(uint *)&plVar2->locations[lVar7][lVar8].field_0x6 >> 4 & 8) == 0) {
                  plVar2->locations[lVar7][lVar8].typ = '\x18';
                  unblock_point(digdepth,iStack_30);
                  iVar4 = local_34 + -3;
                }
                else {
                  if (((u.uprops[0x1e].intrinsic == 0) &&
                      (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                       (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
                    pline("The rock glows then fades.");
                  }
                  local_34 = 0;
                  iVar4 = local_34;
                }
              }
            }
            else if ((*(uint *)&plVar2->locations[lVar7][lVar8].field_0x6 >> 4 & 8) == 0) {
              pcVar5 = in_rooms(level,x,y,0x12);
              if (*pcVar5 != '\0') {
                add_damage(x,y,200);
                bVar1 = true;
              }
              plVar2->locations[lVar7][lVar8].typ = '\x19';
              unblock_point(digdepth,iStack_30);
              iVar4 = local_34 + -3;
            }
            else {
              if ((((u.uprops[0x1e].intrinsic == 0) &&
                   ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                  (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                 ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
                pline("The wall glows then fades.");
              }
              local_34 = 0;
              iVar4 = local_34;
            }
          }
          else if (plVar2->locations[lVar7][lVar8].typ < '\x11') {
            bVar3 = may_dig(level,x,y);
            if (bVar3 == '\0') goto LAB_001860d4;
            if (((plVar2->locations[lVar7][lVar8].typ == '\0') ||
                ('\f' < plVar2->locations[lVar7][lVar8].typ)) &&
               (plVar2->locations[lVar7][lVar8].typ != '\x0f')) {
              if ((plVar2->locations[lVar7][lVar8].typ == '\r') ||
                 (((*(uint *)&(level->flags).field_0x8 >> 0x14 & 1) != 0 &&
                  (plVar2->locations[lVar7][lVar8].typ == '\0')))) {
                plVar2->locations[lVar7][lVar8].typ = '\x19';
                local_34 = local_34 + -3;
              }
              else {
                plVar2->locations[lVar7][lVar8].typ = '\x18';
                local_34 = local_34 + -2;
              }
            }
            else {
              pcVar5 = in_rooms(level,x,y,0x12);
              if (*pcVar5 != '\0') {
                add_damage(x,y,200);
                bVar1 = true;
              }
              watch_dig((monst *)0x0,x,y,'\x01');
              if (((*(uint *)&(level->flags).field_0x8 >> 0x13 & 1) == 0) ||
                 (bVar3 = in_town(digdepth,iStack_30), bVar3 != '\0')) {
                plVar2->locations[lVar7][lVar8].typ = '\x17';
                *(uint *)&plVar2->locations[lVar7][lVar8].field_0x6 =
                     *(uint *)&plVar2->locations[lVar7][lVar8].field_0x6 & 0xfffffe0f;
              }
              else {
                plVar2->locations[lVar7][lVar8].typ = '\x18';
              }
              local_34 = local_34 + -3;
            }
            unblock_point(digdepth,iStack_30);
            iVar4 = local_34;
          }
        }
        else {
          iVar4 = artifact_door(level,digdepth,iStack_30);
          if (iVar4 != 0) {
            if ((viz_array[iStack_30][digdepth] & 2U) != 0) {
              pline("The door glows then fades.");
            }
LAB_001860d4:
            tmp_at(-6,0);
            if ((!bVar9) && (!bVar1)) {
              return;
            }
            pcVar5 = "dig into";
            if (bVar9) {
              pcVar5 = "destroy";
            }
            pay_for_damage(pcVar5,'\0');
            return;
          }
          pcVar5 = in_rooms(level,x,y,0x12);
          if (*pcVar5 != '\0') {
            add_damage(x,y,400);
            bVar9 = true;
          }
          if (plVar2->locations[lVar7][lVar8].typ == '\x0f') {
            plVar2->locations[lVar7][lVar8].typ = '\x17';
          }
          else if ((viz_array[iStack_30][digdepth] & 2U) != 0) {
            pline("The door is razed!");
          }
          watch_dig((monst *)0x0,x,y,'\x01');
          *(uint *)&plVar2->locations[lVar7][lVar8].field_0x6 =
               *(uint *)&plVar2->locations[lVar7][lVar8].field_0x6 & 0xfffffe0f;
          unblock_point(digdepth,iStack_30);
          iVar4 = local_34 + -3;
        }
        local_34 = iVar4;
        digdepth = dx + digdepth;
        iStack_30 = dy + iStack_30;
      } while( true );
    }
    bVar3 = on_level(&u.uz,&dungeon_topology.d_air_level);
    if (((bVar3 == '\0') && (bVar3 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar3 == '\0')
        ) && (((byte)u._1052_1_ >> 1 & 1) == 0)) {
      if ((dz < '\0') || (bVar3 = On_stairs(u.ux,u.uy), bVar3 != '\0')) {
        bVar3 = On_stairs(u.ux,u.uy);
        if (bVar3 != '\0') {
          bVar9 = true;
          if (u.ux != (level->dnladder).sx) {
            bVar9 = u.ux == (level->upladder).sx;
          }
          pcVar5 = "stairs";
          if (bVar9) {
            pcVar5 = "ladder";
          }
          pcVar6 = ceiling((int)u.ux,(int)u.uy);
          pline("The beam bounces off the %s and hits the %s.",pcVar5,pcVar6);
        }
        pcVar5 = ceiling((int)u.ux,(int)u.uy);
        pline("You loosen a rock from the %s.",pcVar5);
        pcVar5 = body_part(8);
        pline("It falls on your %s!",pcVar5);
        bVar9 = false;
        if ((uarmh != (obj *)0x0) &&
           (bVar9 = false, 10 < (*(ushort *)&objects[uarmh->otyp].field_0x11 >> 4 & 0x1f))) {
          bVar9 = (*(ushort *)&objects[uarmh->otyp].field_0x11 >> 4 & 0x1f) < 0x12;
        }
        iVar4 = 6;
        if (bVar9) {
          iVar4 = 2;
        }
        iVar4 = rnd(iVar4);
        losehp(iVar4,"falling rock",0);
        obj = mksobj_at(0x213,level,(int)u.ux,(int)u.uy,'\0','\0');
        if (obj != (obj *)0x0) {
          xname(obj);
          stackobj(obj);
        }
        newsym((int)u.ux,(int)u.uy);
      }
      else {
        watch_dig((monst *)0x0,u.ux,u.uy,'\x01');
        dighole('\0');
      }
    }
  }
  else if (((u.ustuck)->data->mlet != '\x16') && ((u.ustuck)->data != mons + 0x9f)) {
    if (((u.ustuck)->data->mflags1 & 0x40000) != 0) {
      pcVar5 = mon_nam(u.ustuck);
      pcVar5 = s_suffix(pcVar5);
      pcVar6 = mbodypart(mon,0x12);
      pline("You pierce %s %s wall!",pcVar5,pcVar6);
    }
    if (mon->data == mons + 0x13b) {
      mon->mhp = (mon->mhp + 1) / 2;
    }
    else {
      mon->mhp = 1;
    }
    expels(mon,mon->data,((mon->data->mflags1 & 0x40000) != 0 ^ 0xffU) & 1);
  }
  return;
}

Assistant:

void zap_dig(schar dx, schar dy, schar dz)
{
	struct rm *room;
	struct monst *mtmp;
	struct obj *otmp;
	int zx, zy, digdepth;
	boolean shopdoor, shopwall, maze_dig;

	if (u.uswallow) {
	    mtmp = u.ustuck;

	    if (!is_whirly(mtmp->data)) {
		if (is_animal(mtmp->data))
		    pline("You pierce %s %s wall!",
			s_suffix(mon_nam(mtmp)), mbodypart(mtmp, STOMACH));

		/* Juiblex takes less damage from a wand of digging. */
		if (mtmp->data == &mons[PM_JUIBLEX])
		    mtmp->mhp = (mtmp->mhp + 1) / 2;
		else
		    mtmp->mhp = 1;		/* almost dead */

		expels(mtmp, mtmp->data, !is_animal(mtmp->data));
	    }
	    return;
	} /* swallowed */

	if (dz) {
	    if (!Is_airlevel(&u.uz) && !Is_waterlevel(&u.uz) && !Underwater) {
		if (dz < 0 || On_stairs(u.ux, u.uy)) {
		    if (On_stairs(u.ux, u.uy))
			pline("The beam bounces off the %s and hits the %s.",
			      (u.ux == level->dnladder.sx || u.ux == level->upladder.sx) ?
			      "ladder" : "stairs", ceiling(u.ux, u.uy));
		    pline("You loosen a rock from the %s.", ceiling(u.ux, u.uy));
		    pline("It falls on your %s!", body_part(HEAD));
		    losehp(rnd((uarmh && is_metallic(uarmh)) ? 2 : 6),
			   "falling rock", KILLED_BY_AN);
		    otmp = mksobj_at(ROCK, level, u.ux, u.uy, FALSE, FALSE);
		    if (otmp) {
			xname(otmp);	/* set dknown, maybe bknown */
			stackobj(otmp);
		    }
		    newsym(u.ux, u.uy);
		} else {
		    watch_dig(NULL, u.ux, u.uy, TRUE);
		    dighole(FALSE);
		}
	    }
	    return;
	} /* up or down */

	/* normal case: digging across the level */
	shopdoor = shopwall = FALSE;
	maze_dig = level->flags.is_maze_lev && !Is_earthlevel(&u.uz);
	zx = u.ux + dx;
	zy = u.uy + dy;
	digdepth = rn1(18, 8);
	tmp_at(DISP_BEAM, dbuf_effect(E_MISC, E_digbeam));
	while (--digdepth >= 0) {
	    if (!isok(zx,zy)) break;
	    room = &level->locations[zx][zy];
	    tmp_at(zx,zy);
	    win_delay_output();	/* wait a little bit */
	    if (closed_door(level, zx, zy) || room->typ == SDOOR) {
		/* ALI - Artifact doors */
		if (artifact_door(level, zx, zy)) {
		    if (cansee(zx, zy))
			pline("The door glows then fades.");
		    break;
		}
		if (*in_rooms(level, zx,zy,SHOPBASE)) {
		    add_damage(zx, zy, 400L);
		    shopdoor = TRUE;
		}
		if (room->typ == SDOOR)
		    room->typ = DOOR;
		else if (cansee(zx, zy))
		    pline("The door is razed!");
		watch_dig(NULL, zx, zy, TRUE);
		room->doormask = D_NODOOR;
		unblock_point(zx,zy); /* vision */
		digdepth -= 2;
	    } else if (maze_dig) {
		if (IS_WALL(room->typ)) {
		    if (!(room->wall_info & W_NONDIGGABLE)) {
			if (*in_rooms(level, zx,zy,SHOPBASE)) {
			    add_damage(zx, zy, 200L);
			    shopwall = TRUE;
			}
			room->typ = ROOM;
			unblock_point(zx,zy); /* vision */
			digdepth -= 2;
		    } else {
			if (!Blind) pline("The wall glows then fades.");
			digdepth = 0;
		    }
		} else if (IS_TREE(level, room->typ)) { /* check trees before stone */
		    if (!(room->wall_info & W_NONDIGGABLE)) {
			room->typ = ROOM;
			unblock_point(zx,zy); /* vision */
			digdepth -= 2;
		    } else {
			if (!Blind) pline("The tree shudders but is unharmed.");
			digdepth = 0;
		    }
		} else if (room->typ == STONE || room->typ == SCORR) {
		    if (!(room->wall_info & W_NONDIGGABLE)) {
			room->typ = CORR;
			unblock_point(zx,zy); /* vision */
			digdepth -= 2;
		    } else {
			if (!Blind) pline("The rock glows then fades.");
			digdepth = 0;
		    }
		}
	    } else if (IS_ROCK(room->typ)) {
		if (!may_dig(level, zx,zy)) break;
		if (IS_WALL(room->typ) || room->typ == SDOOR) {
		    if (*in_rooms(level, zx,zy,SHOPBASE)) {
			add_damage(zx, zy, 200L);
			shopwall = TRUE;
		    }
		    watch_dig(NULL, zx, zy, TRUE);
		    if (level->flags.is_cavernous_lev && !in_town(zx, zy)) {
			room->typ = CORR;
		    } else {
			room->typ = DOOR;
			room->doormask = D_NODOOR;
		    }
		    digdepth -= 2;
		} else if (IS_TREE(level, room->typ)) {
		    room->typ = ROOM;
		    digdepth -= 2;
		} else {	/* IS_ROCK but not IS_WALL or SDOOR */
		    room->typ = CORR;
		    digdepth--;
		}
		unblock_point(zx,zy); /* vision */
	    }
	    zx += dx;
	    zy += dy;
	} /* while */
	
	tmp_at(DISP_END, 0);	/* closing call */
	if (shopdoor || shopwall)
	    pay_for_damage(shopdoor ? "destroy" : "dig into", FALSE);
	return;
}